

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyself.c
# Opt level: O0

void change_sex(void)

{
  short sVar1;
  byte bVar2;
  bool bVar3;
  int local_10;
  boolean already_polyd;
  
  bVar3 = u.umonnum != u.umonster;
  if ((!bVar3) ||
     (((((youmonst.data)->mflags2 & 0x10000) == 0 && (((youmonst.data)->mflags2 & 0x20000) == 0)) &&
      (((youmonst.data)->mflags2 & 0x40000) == 0)))) {
    flags.female = (flags.female != '\0' ^ 0xffU) & 1;
  }
  if (bVar3) {
    u._1052_1_ = u._1052_1_ & 0xf7 | (((byte)u._1052_1_ >> 3 & 1) == 0) << 3;
  }
  max_rank_sz();
  bVar2 = flags.female;
  if (bVar3) {
    bVar2 = (byte)u._1052_1_ >> 3 & 1;
  }
  if ((bVar2 == 0) || (urole.name.f == (char *)0x0)) {
    strcpy(pl_character,urole.name.m);
  }
  else {
    strcpy(pl_character,urole.name.f);
  }
  bVar2 = flags.female;
  if (bVar3) {
    bVar2 = (byte)u._1052_1_ >> 3 & 1;
  }
  if ((bVar2 == 0) || (sVar1 = urole.femalenum, urole.femalenum == -1)) {
    sVar1 = urole.malenum;
  }
  local_10 = (int)sVar1;
  u.umonster = local_10;
  if (bVar3) {
    if ((u.umonnum == 0x12f) || (u.umonnum == 0x130)) {
      flags.female = (flags.female != '\0' ^ 0xffU) & 1;
      bVar3 = u.umonnum == 0x12f;
      u.umonnum = 0x12f;
      if (bVar3) {
        u.umonnum = 0x130;
      }
      set_uasmon();
    }
  }
  else {
    u.umonnum = local_10;
  }
  return;
}

Assistant:

void change_sex(void)
{
	/* setting u.umonster for caveman/cavewoman or priest/priestess
	   swap unintentionally makes `Upolyd' appear to be true */
	boolean already_polyd = (boolean) Upolyd;

	/* Some monsters are always of one sex and their sex can't be changed */
	/* succubi/incubi can change, but are handled below */
	/* !already_polyd check necessary because is_male() and is_female()
           are true if the player is a priest/priestess */
	if (!already_polyd || (!is_male(youmonst.data) && !is_female(youmonst.data) && !is_neuter(youmonst.data)))
	    flags.female = !flags.female;
	if (already_polyd)	/* poly'd: also change saved sex */
	    u.mfemale = !u.mfemale;
	max_rank_sz();		/* [this appears to be superfluous] */
	if ((already_polyd ? u.mfemale : flags.female) && urole.name.f)
	    strcpy(pl_character, urole.name.f);
	else
	    strcpy(pl_character, urole.name.m);
	u.umonster = ((already_polyd ? u.mfemale : flags.female) && urole.femalenum != NON_PM) ?
			urole.femalenum : urole.malenum;
	if (!already_polyd) {
	    u.umonnum = u.umonster;
	} else if (u.umonnum == PM_SUCCUBUS || u.umonnum == PM_INCUBUS) {
	    flags.female = !flags.female;
	    /* change monster type to match new sex */
	    u.umonnum = (u.umonnum == PM_SUCCUBUS) ? PM_INCUBUS : PM_SUCCUBUS;
	    set_uasmon();
	}
}